

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.cpp
# Opt level: O2

int main(void)

{
  size_type __n;
  allocator_type local_242;
  deflate_encoder enc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> text;
  ifstream in;
  
  std::ifstream::ifstream(&in,"C:\\Users\\Andy\\gilgamesh\\examples\\data\\4GRG.pdb",_S_bin);
  std::istream::seekg((long)&in,_S_beg);
  __n = std::istream::tellg();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&text,__n,(allocator_type *)&buffer);
  std::istream::seekg((long)&in,_S_beg);
  std::istream::read((char *)&in,
                     (long)text.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&buffer,__n,&local_242);
  andyzip::deflate_encoder::encode
            (&enc,buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start,
             buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + __n,
             text.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             text.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + (__n - 1));
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&text.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::ifstream::~ifstream(&in);
  return 0;
}

Assistant:

int main() {
  andyzip::deflate_encoder enc;

  //static const uint8_t text[] = "to be or not to be, that is the question! 1234 1234 1234";
  //static const uint8_t text[] = "123123123";

  std::ifstream in("C:\\Users\\Andy\\gilgamesh\\examples\\data\\4GRG.pdb", std::ios::binary);
  in.seekg(0, std::ios::end);
  size_t size = (size_t)in.tellg();
  std::vector<uint8_t> text(size);
  in.seekg(0, std::ios::beg);
  in.read((char*)text.data(), size);
  std::vector<uint8_t> buffer(size);
  enc.encode(buffer.data(), buffer.data() + size, text.data(), text.data() + size - 1);
}